

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O1

void re_putc(EditLine *el,wint_t c,wchar_t shift)

{
  wchar_t wVar1;
  wint_t **ppwVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  wchar_t wVar6;
  
  iVar3 = wcwidth(c);
  wVar1 = (el->el_terminal).t_size.h;
  iVar5 = 0;
  if (iVar3 != -1) {
    iVar5 = iVar3;
  }
  while ((shift != L'\0' && (wVar1 < (el->el_refresh).r_cursor.h + iVar5))) {
    re_putc(el,0x20,L'\x01');
  }
  ppwVar2 = el->el_vdisplay;
  ppwVar2[(el->el_refresh).r_cursor.v][(el->el_refresh).r_cursor.h] = c;
  if (1 < iVar5) {
    iVar3 = iVar5 + 1;
    lVar4 = (long)iVar5;
    do {
      lVar4 = lVar4 + -1;
      ppwVar2[(el->el_refresh).r_cursor.v][(el->el_refresh).r_cursor.h + lVar4] = 0xffffffff;
      iVar3 = iVar3 + -1;
    } while (2 < iVar3);
  }
  if ((shift != L'\0') &&
     (wVar6 = iVar5 + (el->el_refresh).r_cursor.h, (el->el_refresh).r_cursor.h = wVar6,
     wVar1 <= wVar6)) {
    ppwVar2[(el->el_refresh).r_cursor.v][wVar1] = 0;
    re_nextline(el);
    return;
  }
  return;
}

Assistant:

libedit_private void
re_putc(EditLine *el, wint_t c, int shift)
{
	coord_t *cur = &el->el_refresh.r_cursor;
	int i, w = wcwidth(c);
	int sizeh = el->el_terminal.t_size.h;

	ELRE_DEBUG(1, (__F, "printing %5x '%lc'\r\n", c, c));
	if (w == -1)
		w = 0;

	while (shift && (cur->h + w > sizeh))
	    re_putc(el, ' ', 1);

	el->el_vdisplay[cur->v][cur->h] = c;
	/* assumes !shift is only used for single-column chars */
	i = w;
	while (--i > 0)
		el->el_vdisplay[cur->v][cur->h + i] = MB_FILL_CHAR;

	if (!shift)
		return;

	cur->h += w;	/* advance to next place */
	if (cur->h >= sizeh) {
		/* assure end of line */
		el->el_vdisplay[cur->v][sizeh] = '\0';
		re_nextline(el);
	}
}